

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O1

void lubu(dw_rom *rom)

{
  byte bVar1;
  ulong uVar2;
  uint16_t address;
  ulong uVar3;
  bool bVar4;
  
  doae(rom);
  vpatch(rom,0x1a8e,3,0x2b,0x37,6);
  uVar2 = 0x13b5;
  do {
    uVar3 = uVar2;
    do {
      bVar1 = rom->content[uVar3];
      if ((bVar1 & 3) == 0) {
        rom->content[uVar3] = bVar1 | 1;
      }
      uVar3 = uVar3 + 2;
    } while (uVar3 <= uVar2 + 0x4e);
    bVar4 = uVar2 < 0x15b6;
    uVar2 = uVar2 + 0x100;
  } while (bVar4);
  vpatch(rom,0x12260,0x40,0xe0,0xf0,0xc0,0xe0,0xb0,0x20,0,0x80,0xe0,0xf0,0xf0,0xf0,0xf0,0xf0,0xf0,
         0x70,0xde,0xf8,0xf8,0,0xc0,0xe0,0xc0,0,0x3e,0xde,0xfe,0xc0,0,0,0x80,0x80,0xe0,0xf0,0xc0,
         0xe0,0xb0,0x20,0,0x80,0xe0,0xf0,0xf0,0xf0,0xf0,0xf0,0xf0,0x70,0xc0,0xfc,0x30,0x30,0xc0,0xe0
         ,0xc0,0,0x20,0xdc,0xfc,0xfc,0,0,0x80,0x70);
  vpatch(rom,0x12300,0x80,3,7,0xc,0xe,0x1b,0x1a,8,0x7c,3,7,0xf,0xf,0x1f,0x1f,0xf,0xb,0xfe,0x7f,0xf3,
         0xc,0x1f,0xf,0xf,0,5,0x4e,0xf7,0xc3,0,8,0xe,0xe,3,7,0xc,0xe,0x1b,0x3a,0x78,0x9c,3,7,0xf,0xf
         ,0x1f,0x3f,0xf,0x6b,0x1e,0x3f,3,0xc,0x1f,0xf,3,0,0x75,0x3e,7,3,0,8,0xe,0,0xc0);
  vpatch(rom,0x12400,0x180,3,0x27,0x2c,0x2e,0x3b,0x3a,0x38,0x7c,3,7,0xf,0xf,0x1f,0x1f,0xf,0xb,0xfe,
         0xf,3,0x2c,0x1f,0xf,0xf,0,0x75,0x6e,0x67,3,0,8,0xe,0xe,0xc0,0xe0,0x30,0x70,0xd8,0x5c,0x1e,
         0x39,0xc0,0xe0,0xf0,0xf0,0xf8,0xfc,0xf0,0xd6,0x78,0xfc,0xc0,0x30,0xf8,0xf0,0xc0,0,0xae,0x7c
         ,0xe0,0xc0,0,0x10,0x70,0,0x43);
  vpatch(rom,0x12a20,0x70,0x7f,0xff,0x7c,0x7b,0x1f,0xf,0xf,0,0x74,0xff,0x7f,0x14,0x60,8,0xe,0xe,0xff
         ,0xff,0x26,0xd0,0xf8,0xf0,0x80,0,0x23,0xff,0xe6,0x20,0,0x10,0x70,0,3,7,7,0xf,0xf,0x7f,0xff,
         0x7f,3,7,7,0xf,0xf,0xf,7,3,0xc0,0xe2,0xe7,0xf3,0xf3,0xfd,0xff,0xff,0xc0,0xe2,0xe7,0xff,0xff
         ,0xe3,0xc1,3,0xff);
  vpatch(rom,0x12aa0,0x10,0xfd,0xff,0xff,0x7f,0x7f,0xff,0x7e,0,0xe3,0xfd,0xff,0x7f,0,0x18,0xfc,199);
  vpatch(rom,0x12ac0,0x10,0xc0,0xe2,0xe7,0xf3,0xf3,0xfd,0xff,0xff,0xc0,0xe2,0xe7,0xff,0xff,0xf3,0xe1
         ,0xc3);
  vpatch(rom,0x12ae0,0x10,0xfd,0xff,0xff,0x7f,0x7f,0xff,0x7e,0,0xd3,0xfd,0xff,0x47,0,0x18,0x7c,0x3c)
  ;
  vpatch(rom,0x12b50,0x10,0xf0,0xf8,0xc,0x9c,0xf6,0x97,7,0xf,0xf0,0xf8,0xfc,0xfc,0xfe,0xff,0xfc,0xf4
        );
  vpatch(rom,0x12b80,0x20,0xf0,0xf8,0xc,0x9c,0xf6,0x97,4,0xf,0xf0,0xf8,0xfc,0xfc,0xfe,0xff,0xfc,0xf4
         ,0x3e,0x7f,0xfc,0xee,0xeb,0xf2,0xf0,0xf8,0x3e,0x7f,0xff,0xff,0xff,0xff,0x1f,199);
  vpatch(rom,0x12bd0,0x10,0x3e,0x7f,0xfc,0xee,0xeb,0xf2,0xf0,0xf8,0x3e,0x7f,0xff,0xff,0xff,0xff,0x3f
         ,0x87);
  return;
}

Assistant:

static void lubu(dw_rom *rom)
{
    doae(rom);
    vpatch(rom, 0x01a8e,   3, 0x2b, 0x37, 0x06);
    set_player_palette(rom, 1);
    vpatch(rom, 0x12260,  64, 0xE0, 0xF0, 0xC0, 0xE0, 0xB0, 0x20, 0x00, 0x80, 0xE0, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0x70, 0xDE, 0xF8, 0xF8, 0x00, 0xC0, 0xE0, 0xC0, 0x00, 0x3E, 0xDE, 0xFE, 0xC0, 0x00, 0x00, 0x80, 0x80, 0xE0, 0xF0, 0xC0, 0xE0, 0xB0, 0x20, 0x00, 0x80, 0xE0, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0x70, 0xC0, 0xFC, 0x30, 0x30, 0xC0, 0xE0, 0xC0, 0x00, 0x20, 0xDC, 0xFC, 0xFC, 0x00, 0x00, 0x80, 0x70);
    vpatch(rom, 0x12300, 128, 0x03, 0x07, 0x0C, 0x0E, 0x1B, 0x1A, 0x08, 0x7C, 0x03, 0x07, 0x0F, 0x0F, 0x1F, 0x1F, 0x0F, 0x0B, 0xFE, 0x7F, 0xF3, 0x0C, 0x1F, 0x0F, 0x0F, 0x00, 0x05, 0x4E, 0xF7, 0xC3, 0x00, 0x08, 0x0E, 0x0E, 0x03, 0x07, 0x0C, 0x0E, 0x1B, 0x3A, 0x78, 0x9C, 0x03, 0x07, 0x0F, 0x0F, 0x1F, 0x3F, 0x0F, 0x6B, 0x1E, 0x3F, 0x03, 0x0C, 0x1F, 0x0F, 0x03, 0x00, 0x75, 0x3E, 0x07, 0x03, 0x00, 0x08, 0x0E, 0x00, 0xC0, 0xE0, 0xE0, 0xF0, 0xF0, 0xFC, 0xFE, 0xFF, 0xC0, 0xE0, 0xE0, 0xF0, 0xF0, 0xE0, 0xC0, 0x00, 0xFF, 0xFF, 0x27, 0xD0, 0xF8, 0xF0, 0x80, 0x00, 0x23, 0xFF, 0xE7, 0x26, 0x00, 0x10, 0x70, 0x00, 0xC0, 0xE0, 0xE0, 0xF0, 0xF0, 0xFE, 0xFF, 0xFE, 0xC0, 0xE0, 0xE0, 0xF0, 0xF0, 0xF0, 0xE0, 0xC0, 0xFE, 0xF6, 0x20, 0xD0, 0xF8, 0xF0, 0xF0, 0x00, 0x2E, 0xF6, 0xE0, 0x20, 0x00, 0x10, 0x70, 0x70);
    vpatch(rom, 0x12400, 384, 0x03, 0x27, 0x2C, 0x2E, 0x3B, 0x3A, 0x38, 0x7C, 0x03, 0x07, 0x0F, 0x0F, 0x1F, 0x1F, 0x0F, 0x0B, 0xFE, 0x0F, 0x03, 0x2C, 0x1F, 0x0F, 0x0F, 0x00, 0x75, 0x6E, 0x67, 0x03, 0x00, 0x08, 0x0E, 0x0E, 0xC0, 0xE0, 0x30, 0x70, 0xD8, 0x5C, 0x1E, 0x39, 0xC0, 0xE0, 0xF0, 0xF0, 0xF8, 0xFC, 0xF0, 0xD6, 0x78, 0xFC, 0xC0, 0x30, 0xF8, 0xF0, 0xC0, 0x00, 0xAE, 0x7C, 0xE0, 0xC0, 0x00, 0x10, 0x70, 0x00, 0x43, 0x47, 0x4C, 0x4E, 0x5B, 0x7A, 0xF8, 0xFC, 0x03, 0x07, 0x0F, 0x0F, 0x1F, 0x3F, 0x0F, 0xEB, 0x3E, 0x2F, 0x43, 0x0C, 0x1F, 0x0F, 0x03, 0x00, 0xC5, 0xEE, 0x07, 0x03, 0x00, 0x08, 0x0E, 0x00, 0xC0, 0xE0, 0x30, 0x70, 0xD8, 0x5C, 0x18, 0x3E, 0xC0, 0xE0, 0xF0, 0xF0, 0xF8, 0xFC, 0xF8, 0xD0, 0x7F, 0xFE, 0xCF, 0x30, 0xF8, 0xF0, 0xF0, 0x00, 0xA0, 0x72, 0xEF, 0xC3, 0x00, 0x10, 0x70, 0x70, 0x03, 0x07, 0x07, 0x0F, 0x0F, 0x7F, 0xFF, 0x7F, 0x03, 0x07, 0x07, 0x0F, 0x0F, 0x0F, 0x07, 0x03, 0x7F, 0x6F, 0x04, 0x0B, 0x1F, 0x0F, 0x0F, 0x00, 0x74, 0x6F, 0x07, 0x04, 0x00, 0x08, 0x0E, 0x0E, 0xC0, 0xE4, 0xE4, 0xF4, 0xF4, 0xFC, 0xFE, 0xFF, 0xC0, 0xE0, 0xE0, 0xF0, 0xF0, 0xE0, 0xC0, 0x00, 0xFF, 0xFE, 0x2C, 0xD4, 0xF8, 0xF0, 0x80, 0x00, 0x23, 0xFE, 0xEC, 0x20, 0x00, 0x10, 0x70, 0x00, 0x03, 0x07, 0x07, 0x0F, 0x0F, 0x3F, 0x7F, 0xFF, 0x03, 0x07, 0x07, 0x0F, 0x0F, 0x07, 0x03, 0x00, 0xFF, 0xFF, 0xE4, 0x0B, 0x1F, 0x0F, 0x01, 0x00, 0xC4, 0xFF, 0xE7, 0x64, 0x00, 0x08, 0x0E, 0x00, 0xC2, 0xE2, 0xE2, 0xF2, 0xF2, 0xFE, 0xFF, 0xFF, 0xC0, 0xE0, 0xE0, 0xF0, 0xF0, 0xF0, 0xE0, 0xC1, 0xFF, 0xF6, 0x22, 0xD0, 0xF8, 0xF0, 0xF0, 0x00, 0x2F, 0xF6, 0xE0, 0x20, 0x00, 0x10, 0x70, 0x70, 0x03, 0x07, 0x0F, 0x0E, 0x1E, 0x1F, 0x3F, 0x3F, 0x03, 0x07, 0x0F, 0x0F, 0x1F, 0x1F, 0x23, 0x08, 0x3F, 0x7F, 0x70, 0x07, 0x0F, 0x1F, 0x0F, 0x00, 0x1D, 0x7F, 0x77, 0x60, 0x00, 0x03, 0x0F, 0x07, 0xE0, 0xF4, 0xC4, 0xE4, 0xB4, 0x24, 0x04, 0x84, 0xE0, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0x70, 0xDE, 0xF8, 0xF8, 0x04, 0xC0, 0xE0, 0xC0, 0x00, 0x3E, 0xDE, 0xFE, 0xC0, 0x00, 0x00, 0x80, 0x80, 0x03, 0x07, 0x0F, 0x0E, 0x1E, 0x1F, 0x3F, 0x3F, 0x03, 0x07, 0x0F, 0x0F, 0x1F, 0x1F, 0x31, 0x24, 0x1F, 0x0F, 0x0F, 0x07, 0x0F, 0x1F, 0x1F, 0x00, 0x0E, 0x0F, 0x0F, 0x07, 0x00, 0x03, 0x3F, 0x38, 0xE0, 0xF0, 0xC8, 0xE8, 0xB8, 0x28, 0x08, 0x88, 0xE0, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0x70, 0xC8, 0xFC, 0x30, 0x30, 0xC8, 0xE0, 0xC0, 0x00, 0x20, 0xDC, 0xFC, 0xFC, 0x00, 0x00, 0x80, 0x70);
    vpatch(rom, 0x12a20, 112, 0x7F, 0xFF, 0x7C, 0x7B, 0x1F, 0x0F, 0x0F, 0x00, 0x74, 0xFF, 0x7F, 0x14, 0x60, 0x08, 0x0E, 0x0E, 0xFF, 0xFF, 0x26, 0xD0, 0xF8, 0xF0, 0x80, 0x00, 0x23, 0xFF, 0xE6, 0x20, 0x00, 0x10, 0x70, 0x00, 0x03, 0x07, 0x07, 0x0F, 0x0F, 0x7F, 0xFF, 0x7F, 0x03, 0x07, 0x07, 0x0F, 0x0F, 0x0F, 0x07, 0x03, 0xC0, 0xE2, 0xE7, 0xF3, 0xF3, 0xFD, 0xFF, 0xFF, 0xC0, 0xE2, 0xE7, 0xFF, 0xFF, 0xE3, 0xC1, 0x03, 0xFF, 0xFF, 0xFC, 0x1B, 0x1F, 0x0F, 0x01, 0x00, 0xC4, 0xFF, 0x9F, 0x64, 0x00, 0x08, 0x0E, 0x00, 0xFF, 0xF7, 0x26, 0xD0, 0xF8, 0xF0, 0xF0, 0x00, 0x2F, 0xF7, 0xE6, 0x20, 0x00, 0x10, 0x70, 0x70, 0x03, 0x07, 0x07, 0x0F, 0x0F, 0x3F, 0x7F, 0xFF, 0x03, 0x07, 0x07, 0x0F, 0x0F, 0x07, 0x03, 0x00);
    vpatch(rom, 0x12aa0,  16, 0xFD, 0xFF, 0xFF, 0x7F, 0x7F, 0xFF, 0x7E, 0x00, 0xE3, 0xFD, 0xFF, 0x7F, 0x00, 0x18, 0xFC, 0xC7);
    vpatch(rom, 0x12ac0,  16, 0xC0, 0xE2, 0xE7, 0xF3, 0xF3, 0xFD, 0xFF, 0xFF, 0xC0, 0xE2, 0xE7, 0xFF, 0xFF, 0xF3, 0xE1, 0xC3);
    vpatch(rom, 0x12ae0,  16, 0xFD, 0xFF, 0xFF, 0x7F, 0x7F, 0xFF, 0x7E, 0x00, 0xD3, 0xFD, 0xFF, 0x47, 0x00, 0x18, 0x7C, 0x3C);
    vpatch(rom, 0x12b50,  16, 0xF0, 0xF8, 0x0C, 0x9C, 0xF6, 0x97, 0x07, 0x0F, 0xF0, 0xF8, 0xFC, 0xFC, 0xFE, 0xFF, 0xFC, 0xF4);
    vpatch(rom, 0x12b80,  32, 0xF0, 0xF8, 0x0C, 0x9C, 0xF6, 0x97, 0x04, 0x0F, 0xF0, 0xF8, 0xFC, 0xFC, 0xFE, 0xFF, 0xFC, 0xF4, 0x3E, 0x7F, 0xFC, 0xEE, 0xEB, 0xF2, 0xF0, 0xF8, 0x3E, 0x7F, 0xFF, 0xFF, 0xFF, 0xFF, 0x1F, 0xC7);
    vpatch(rom, 0x12bd0,  16, 0x3E, 0x7F, 0xFC, 0xEE, 0xEB, 0xF2, 0xF0, 0xF8, 0x3E, 0x7F, 0xFF, 0xFF, 0xFF, 0xFF, 0x3F, 0x87);
}